

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_concat.cpp
# Opt level: O2

ScalarFunction * duckdb::MapConcatFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff34;
  FunctionNullHandling in_stack_ffffffffffffff40;
  code *bind_lambda;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_98;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"map_concat",(allocator *)&local_60);
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_78,LIST);
  bind_lambda = MapConcatFunction;
  LogicalType::LogicalType(&local_48,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_48;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff2c;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff34;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_30,(vector<duckdb::LogicalType,_true> *)&local_98,&local_78,
             (scalar_function_t *)&stack0xffffffffffffff48,MapConcatBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_ffffffffffffff40,bind_lambda);
  LogicalType::~LogicalType(&local_48);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff48);
  LogicalType::~LogicalType(&local_78);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_98);
  ::std::__cxx11::string::~string((string *)&local_30);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  LogicalType::LogicalType(&local_60,ANY);
  LogicalType::operator=(&(in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs,&local_60)
  ;
  LogicalType::~LogicalType(&local_60);
  return in_RDI;
}

Assistant:

ScalarFunction MapConcatFun::GetFunction() {
	//! the arguments and return types are actually set in the binder function
	ScalarFunction fun("map_concat", {}, LogicalTypeId::LIST, MapConcatFunction, MapConcatBind);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.varargs = LogicalType::ANY;
	return fun;
}